

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

double __thiscall
imrt::ApertureILS::improvementIntensity
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  _List_node_base *p_Var1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *plVar5;
  int iVar6;
  undefined7 in_register_00000009;
  _List_node_base *__node;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  undefined3 in_register_00000089;
  int iVar9;
  ulong uVar10;
  ulong unaff_R15;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_b8;
  Station *local_a0;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_98;
  undefined4 local_7c;
  double local_78;
  _List_node_base *local_70;
  Plan *local_68;
  undefined4 local_5c;
  ApertureILS *local_58;
  ulong local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_5c = CONCAT31(in_register_00000089,best_improvement);
  local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8;
  local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
  local_7c = (undefined4)CONCAT71(in_register_00000009,open_beamlet);
  local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node._M_size = 0;
  local_a0 = station;
  local_78 = c_eval;
  local_68 = P;
  local_58 = this;
  Station::getOpen((vector<int,_std::allocator<int>_> *)&local_98,station,beamlet);
  p_Var7 = local_98.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  local_70 = local_98.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  if ((long)local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev -
      (long)local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[NOPT] ",7);
  }
  else {
    uVar10 = (long)local_98.
                   super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev -
             (long)local_98.
                   super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next >> 2;
    local_50 = uVar10;
    iVar6 = rand();
    uVar10 = (ulong)(long)iVar6 % uVar10;
    local_48 = -1.0;
    uStack_40 = 0;
    iVar6 = 0;
    do {
      iVar9 = (int)uVar10;
      if ((char)local_7c == '\0') {
        Station::modifyIntensityAperture_abi_cxx11_
                  (&local_98,local_a0,*(int *)((long)&p_Var7->_M_next + (long)iVar9 * 4),
                   (double)-local_58->step_intensity);
        p_Var8 = local_b8.
                 super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        if (local_b8.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
          do {
            p_Var1 = p_Var8->_M_next;
            operator_delete(p_Var8);
            p_Var8 = p_Var1;
          } while (p_Var1 != (_List_node_base *)&local_b8);
        }
      }
      else {
        Station::modifyIntensityAperture_abi_cxx11_
                  (&local_98,local_a0,*(int *)((long)&p_Var7->_M_next + (long)iVar9 * 4),
                   (double)local_58->step_intensity);
        p_Var8 = local_b8.
                 super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        if (local_b8.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
          do {
            p_Var1 = p_Var8->_M_next;
            operator_delete(p_Var8);
            p_Var8 = p_Var1;
          } while (p_Var1 != (_List_node_base *)&local_b8);
        }
      }
      local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next == (_List_node_base *)&local_98) {
        plVar5 = &local_b8;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8;
      }
      else {
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next =
             local_98.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev =
             local_98.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
        (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_b8;
        (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_b8;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size =
             local_98.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node._M_size;
        plVar5 = &local_98;
      }
      (plVar5->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
      _M_impl._M_node._M_size = 0;
      local_78 = Plan::incremental_eval(local_68,local_a0,&local_b8);
      bVar2 = -(0.0 <= local_48) & -(local_48 - local_78 <= 1e-05);
      uVar3 = unaff_R15;
      if ((bVar2 & 1) == 0) {
        uStack_40 = 0;
        uVar3 = uVar10;
        local_48 = local_78;
      }
      unaff_R15 = uVar3 & 0xffffffff;
      if (((bVar2 | (byte)local_5c) & 1) == 0) goto LAB_00124891;
      Station::undoLast_abi_cxx11_(&local_98,local_a0);
      p_Var7 = local_b8.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      if (local_b8.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
        do {
          p_Var8 = p_Var7->_M_next;
          operator_delete(p_Var7);
          p_Var7 = p_Var8;
        } while (p_Var8 != (_List_node_base *)&local_b8);
      }
      local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next == (_List_node_base *)&local_98) {
        plVar5 = &local_b8;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8;
      }
      else {
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next =
             local_98.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev =
             local_98.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
        (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_b8;
        (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_b8;
        local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size =
             local_98.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node._M_size;
        plVar5 = &local_98;
      }
      (plVar5->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
      _M_impl._M_node._M_size = 0;
      p_Var7 = local_70;
      if (local_b8.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size != 0) {
        Plan::incremental_eval(local_68,local_a0,&local_b8);
      }
      iVar6 = iVar6 + 1;
      if ((bVar2 & 1) == 0) {
        iVar6 = 1;
      }
      uVar4 = iVar9 + 1U;
      if (local_50 == (long)(int)(iVar9 + 1U)) {
        uVar4 = 0;
      }
      uVar10 = (ulong)uVar4;
    } while (local_50 != (long)iVar6);
    if ((char)local_7c == '\0') {
      Station::modifyIntensityAperture_abi_cxx11_
                (&local_98,local_a0,*(int *)((long)&p_Var7->_M_next + (long)(int)uVar3 * 4),1.0);
      p_Var8 = local_b8.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      if (local_b8.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
        do {
          p_Var1 = p_Var8->_M_next;
          operator_delete(p_Var8);
          p_Var8 = p_Var1;
        } while (p_Var1 != (_List_node_base *)&local_b8);
      }
    }
    else {
      Station::modifyIntensityAperture_abi_cxx11_
                (&local_98,local_a0,*(int *)((long)&p_Var7->_M_next + (long)(int)uVar3 * 4),-1.0);
      p_Var8 = local_b8.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      if (local_b8.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
        do {
          p_Var1 = p_Var8->_M_next;
          operator_delete(p_Var8);
          p_Var8 = p_Var1;
        } while (p_Var1 != (_List_node_base *)&local_b8);
      }
    }
    local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node._M_size = 0;
    if (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_98) {
      plVar5 = &local_b8;
      local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
      local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8;
    }
    else {
      local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next =
           local_98.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
      plVar5 = &local_98;
      local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev =
           local_98.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_prev;
      (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_b8;
      (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_b8;
      local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size =
           local_98.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node._M_size;
    }
    (plVar5->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
    _M_impl._M_node._M_size = 0;
    local_78 = Plan::incremental_eval(local_68,local_a0,&local_b8);
  }
LAB_00124891:
  if (p_Var7 != (_List_node_base *)0x0) {
    operator_delete(p_Var7);
  }
  p_Var7 = local_b8.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (local_b8.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
    do {
      p_Var8 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var7);
      p_Var7 = p_Var8;
    } while (p_Var8 != (_List_node_base *)&local_b8);
  }
  return local_78;
}

Assistant:

double ApertureILS::improvementIntensity(int beamlet, Station& station, bool open_beamlet, 
                                         double c_eval, Plan & P, bool best_improvement) {
  
  double local_best =-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag = true;
  vector<int> a_list;
  
  a_list = station.getOpen(beamlet);
  
  if (a_list.size()<1) {
    //cout << endl << "Warning: not possible to make intensity change beamlet:" << beamlet <<endl;
    cout << "[NOPT] ";
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i=0;

  // Check every aperture 
  while(flag) {
    if (open_beamlet) {
      diff = station.modifyIntensityAperture(a_list[a], step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<<"  Increasing intensity aperture: " << a <<" eval: " << aux_eval << " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    } else {
      diff = station.modifyIntensityAperture(a_list[a], -step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<< "  Reducing intensity aperture: " << a <<" eval: " << aux_eval <<  " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    }
    
    // First improvement
    if (local_best < 0 || (local_best- aux_eval)>0.00001){
      local_best=aux_eval;
      local_a=a;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    //Undo change
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i==a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    diff = station.modifyIntensityAperture(a_list[local_a], 1);
    local_best = P.incremental_eval(station, diff);
  } else{
    diff = station.modifyIntensityAperture(a_list[local_a], -1);
    local_best = P.incremental_eval(station, diff);
  }
  return(local_best);
}